

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

string * webfront::websocket::getHashedSecKey(string *key)

{
  array<unsigned_int,_5UL> input;
  string *in_RDI;
  char *rfc6455Guid;
  undefined1 in_stack_000000f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __sv_type local_40;
  undefined8 in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  
  std::operator+(&local_60,(char *)in_RDI);
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff60);
  crypto::sha1((string_view)in_stack_000000f8);
  input._M_elems._8_8_ = in_stack_ffffffffffffffd8;
  input._M_elems[0] = (int)in_stack_ffffffffffffffd0;
  input._M_elems[1] = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  input._M_elems[4] = in_stack_ffffffffffffffe0;
  base64::encodeInNetworkOrder<std::array<unsigned_int,_5UL>_>(input);
  std::__cxx11::string::~string(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

[[nodiscard]] inline std::string getHashedSecKey(std::string key) {
    constexpr auto rfc6455Guid = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    return base64::encodeInNetworkOrder(crypto::sha1(key + rfc6455Guid));
}